

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cVertexAttrib64BitTest.cpp
# Opt level: O3

IterateResult __thiscall VertexAttrib64Bit::VAOTest::iterate(VAOTest *this)

{
  bool bVar1;
  bool instanced;
  bool bVar2;
  int iVar3;
  GLenum err;
  undefined4 extraout_var;
  bool zero_vertex_attrib_divisor;
  _draw_call_type draw_call;
  bool bVar4;
  bool result;
  
  iVar3 = (*((this->super_Base).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  memcpy(&(this->super_Base).gl,(void *)CONCAT44(extraout_var,iVar3),0x1a28);
  Base::RequireExtension(&this->super_Base,"GL_ARB_vertex_attrib_64bit");
  initBuffers(this);
  initBufferObjects(this);
  initProgramObject(this);
  initVAO(this);
  (*(this->super_Base).gl.useProgram)(this->m_po_id);
  err = (*(this->super_Base).gl.getError)();
  glu::checkError(err,"glUseProgram() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cVertexAttrib64BitTest.cpp"
                  ,0xed3);
  draw_call = DRAW_CALL_TYPE_ARRAYS;
  result = true;
  bVar2 = true;
  do {
    bVar1 = bVar2;
    instanced = false;
    bVar2 = true;
    do {
      bVar4 = bVar2;
      bVar2 = true;
      do {
        zero_vertex_attrib_divisor = bVar2;
        bVar2 = executeTest(this,draw_call,instanced,zero_vertex_attrib_divisor);
        result = (bool)(result & bVar2);
        bVar2 = false;
      } while (zero_vertex_attrib_divisor);
      instanced = true;
      bVar2 = false;
    } while (bVar4);
    draw_call = DRAW_CALL_TYPE_ELEMENTS;
    bVar2 = false;
  } while (bVar1);
  Base::IterateStop(&this->super_Base,result);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult VAOTest::iterate()
{
	IterateStart();

	bool result = true;

	RequireExtension("GL_ARB_vertex_attrib_64bit");

	/* Initialize GL objects required to run the test */
	initBuffers();
	initBufferObjects();
	initProgramObject();
	initVAO();

	/* Activate the program object before we continue */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed.");

	/* Iterate through all draw call combinations */
	for (int n_draw_call_type = 0; n_draw_call_type < DRAW_CALL_TYPE_COUNT; ++n_draw_call_type)
	{
		_draw_call_type draw_call = (_draw_call_type)n_draw_call_type;

		for (int n_instanced_draw_call = 0; n_instanced_draw_call <= 1; /* false & true */
			 ++n_instanced_draw_call)
		{
			bool instanced_draw_call = (n_instanced_draw_call == 1);

			for (int n_vertex_attrib_divisor = 0; n_vertex_attrib_divisor <= 1; /* 0 & non-zero divisor */
				 ++n_vertex_attrib_divisor)
			{
				bool zero_vertex_attrib_divisor = (n_vertex_attrib_divisor == 0);

				/* Execute the test */
				result &= executeTest(draw_call, instanced_draw_call, zero_vertex_attrib_divisor);
			} /* for (two vertex attrib divisor configurations) */
		}	 /* for (non-instanced & instanced draw calls) */
	}		  /* for (array-based & indiced draw calls) */

	/* Done */
	return IterateStop(result);
}